

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeRTASParallelOperationJoinExt(ze_rtas_parallel_operation_ext_handle_t hParallelOperation)

{
  ze_pfnRTASParallelOperationJoinExt_t pfnJoinExt;
  ze_result_t result;
  ze_rtas_parallel_operation_ext_handle_t hParallelOperation_local;
  
  pfnJoinExt._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c190 != (code *)0x0) {
    pfnJoinExt._4_4_ = (*DAT_0011c190)(hParallelOperation);
  }
  return pfnJoinExt._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeRTASParallelOperationJoinExt(
        ze_rtas_parallel_operation_ext_handle_t hParallelOperation  ///< [in] handle of parallel operation object
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnJoinExt = context.zeDdiTable.RTASParallelOperation.pfnJoinExt;
        if( nullptr != pfnJoinExt )
        {
            result = pfnJoinExt( hParallelOperation );
        }
        else
        {
            // generic implementation
        }

        return result;
    }